

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               uint32_t *validation_data)

{
  Nullable<const_char_*> failure_msg;
  FieldType local_61;
  ExtensionInfo local_60;
  
  local_60.message = (MessageLite *)CONCAT44(local_60.message._4_4_,0xe);
  local_61 = type;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<unsigned_char,google::protobuf::internal::WireFormatLite::FieldType>
                          (&local_61,(FieldType *)&local_60,"type == WireFormatLite::TYPE_ENUM");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_60._15_8_ = 0;
    local_60.field_6._7_1_ = 0;
    local_60.descriptor._0_7_ = 0;
    local_60._39_8_ = 0;
    local_60.lazy_eager_verify_func._7_1_ = 0;
    local_60.field_6._8_7_ = SUB87(validation_data,0);
    local_60.field_6._15_1_ = (undefined1)((ulong)validation_data >> 0x38);
    local_60.message = extendee;
    local_60.number = number;
    local_60.type = type;
    local_60.is_repeated = is_repeated;
    local_60.is_packed = is_packed;
    anon_unknown_59::Register(&local_60);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,0x95,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* extendee,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         const uint32_t* validation_data) {
  ABSL_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.enum_validity_check.func = nullptr;
  info.enum_validity_check.arg = validation_data;
  Register(info);
}